

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O1

void __thiscall
QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice
          (QByteDeviceWrappingIoDevice *this,QNonContiguousByteDevice *bd)

{
  QSlotObjectBase *slotObjRaw;
  long in_FS_OFFSET;
  code *local_50;
  undefined8 local_48;
  QObject local_40;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevice::QIODevice((QIODevice *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_006a80f0;
  *(QNonContiguousByteDevice **)(this + 0x10) = bd;
  local_50 = QIODevice::readyRead;
  local_48 = 0;
  local_40.d_ptr.d = (QObjectData *)QNonContiguousByteDevice::readyRead;
  local_30 = 0;
  slotObjRaw = (QSlotObjectBase *)operator_new(0x20);
  (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  slotObjRaw->m_impl =
       QtPrivate::QCallableObject<void_(QIODevice::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(slotObjRaw + 1) = QIODevice::readyRead;
  slotObjRaw[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_40,&bd->super_QObject,&local_40.d_ptr.d,(QObject *)this,&local_50,slotObjRaw,
             AutoConnection,(int *)0x0,&QNonContiguousByteDevice::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_40);
  (**(code **)(*(long *)this + 0x68))(this,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice(QNonContiguousByteDevice *bd)
    : QIODevice(nullptr), byteDevice(bd)
{
    connect(bd, &QNonContiguousByteDevice::readyRead, this, &QIODevice::readyRead);

    open(ReadOnly);
}